

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

bool __thiscall cs::structure::operator==(structure *this,structure *s)

{
  domain_type *pdVar1;
  element_type *this_00;
  ctrl_t *pcVar2;
  size_t sVar3;
  size_type name;
  bool bVar4;
  bool bVar5;
  var *pvVar6;
  bool *pbVar7;
  const_iterator __begin3;
  allocator local_81;
  any local_80;
  any local_78;
  any local_70;
  structure *local_68;
  string local_60;
  structure *local_40;
  structure *local_38;
  
  local_68 = s;
  bVar4 = type_id::operator!=(&s->m_id,&this->m_id);
  if (bVar4) {
    bVar4 = false;
  }
  else {
    if (this->m_shadow == false) {
      pdVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      std::__cxx11::string::string((string *)&local_60,"equal",(allocator *)&local_80);
      bVar4 = domain_type::exist(pdVar1,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (bVar4) {
        pdVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string((string *)&local_60,"equal",&local_81);
        pvVar6 = domain_type::get_var(pdVar1,&local_60);
        local_38 = this;
        cs_impl::any::make<cs::structure,cs::structure_const*>(&local_70,&local_38);
        local_40 = local_68;
        cs_impl::any::make<cs::structure,cs::structure_const*>(&local_78,&local_40);
        invoke<cs_impl::any,cs_impl::any>((cs *)&local_80,pvVar6,&local_70,&local_78);
        pbVar7 = cs_impl::any::const_val<bool>(&local_80);
        bVar4 = *pbVar7;
        cs_impl::any::recycle(&local_80);
        cs_impl::any::recycle(&local_78);
        cs_impl::any::recycle(&local_70);
        std::__cxx11::string::~string((string *)&local_60);
        return bVar4;
      }
    }
    this_00 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60._0_16_ =
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)this_00);
    pcVar2 = (this_00->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    sVar3 = (this_00->m_reflect).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            .capacity_;
    while (bVar4 = local_60._M_dataplus._M_p == pcVar2 + sVar3, !bVar4) {
      name = local_60._M_string_length;
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_60._M_string_length,"parent");
      if (bVar5) {
        pvVar6 = domain_type::get_var
                           ((local_68->m_data).
                            super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (string *)name);
        bVar5 = cs_impl::any::operator!=
                          (pvVar6,(((this->m_data).
                                    super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_slot).
                                  super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                                  _M_impl.super__Vector_impl_data._M_start + *(long *)(name + 0x20))
        ;
        if (bVar5) {
          return bVar4;
        }
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::iterator::operator++((iterator *)&local_60);
    }
  }
  return bVar4;
}

Assistant:

bool operator==(const structure &s) const
		{
			if (s.m_id != m_id)
				return false;
			if (!m_shadow && m_data->exist("equal"))
				return invoke(m_data->get_var("equal"), var::make<structure>(this),
				              var::make<structure>(&s)).const_val<bool>();
			else {
				for (auto &it: *m_data)
					if (it.first != "parent" && s.m_data->get_var(it.first) != m_data->get_var_by_id(it.second))
						return false;
				return true;
			}
		}